

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

uint32_t idForLocale(char *locale,char *countryAndVariant,int capacity,UErrorCode *ec)

{
  int iVar1;
  size_t sVar2;
  undefined4 in_register_00000014;
  uint32_t uVar3;
  uint uVar4;
  char variant [157];
  
  ulocimp_getRegionForSupplementalData_63
            (locale,'\0',countryAndVariant,0x9d,
             (UErrorCode *)CONCAT44(in_register_00000014,capacity));
  uloc_getVariant_63(locale,variant,0x9d,(UErrorCode *)CONCAT44(in_register_00000014,capacity));
  uVar3 = 0;
  if (variant[0] != '\0') {
    iVar1 = bcmp(variant,"EURO",5);
    uVar4 = (uint)(CONCAT71(variant._1_7_,variant[0]) == 0x4f525545455250) * 2 | (uint)(iVar1 == 0);
    uVar3 = 0;
    if (uVar4 != 0) {
      sVar2 = strlen(countryAndVariant);
      (countryAndVariant + sVar2)[0] = '_';
      (countryAndVariant + sVar2)[1] = '\0';
      strcat(countryAndVariant,variant);
      uVar3 = uVar4;
    }
  }
  return uVar3;
}

Assistant:

static uint32_t
idForLocale(const char* locale, char* countryAndVariant, int capacity, UErrorCode* ec)
{
    uint32_t variantType = 0;
    // !!! this is internal only, assumes buffer is not null and capacity is sufficient
    // Extract the country name and variant name.  We only
    // recognize two variant names, EURO and PREEURO.
    char variant[ULOC_FULLNAME_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, FALSE, countryAndVariant, capacity, ec);
    uloc_getVariant(locale, variant, sizeof(variant), ec);
    if (variant[0] != 0) {
        variantType = (uint32_t)(0 == uprv_strcmp(variant, VAR_EURO))
                   | ((uint32_t)(0 == uprv_strcmp(variant, VAR_PRE_EURO)) << 1);
        if (variantType)
        {
            uprv_strcat(countryAndVariant, VAR_DELIM_STR);
            uprv_strcat(countryAndVariant, variant);
        }
    }
    return variantType;
}